

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

void sysbvm_stackFrame_printStackTrace(sysbvm_context_t *context,sysbvm_tuple_t stackTrace)

{
  FILE *__stream;
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t stackTraceRecordString;
  sysbvm_tuple_t stackTraceRecord;
  size_t i;
  size_t stackTraceSize;
  sysbvm_tuple_t stackTrace_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_array_getSize(stackTrace);
  for (stackTraceRecord = 0; stackTraceRecord < sVar1; stackTraceRecord = stackTraceRecord + 1) {
    sVar2 = sysbvm_array_at(stackTrace,stackTraceRecord);
    sVar2 = sysbvm_tuple_asString(context,sVar2);
    __stream = _stderr;
    sVar3 = sysbvm_tuple_getSizeInBytes(sVar2);
    fprintf(__stream,"%.*s\n",sVar3 & 0xffffffff,sVar2 + 0x10);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_printStackTrace(sysbvm_context_t *context, sysbvm_tuple_t stackTrace)
{
    size_t stackTraceSize = sysbvm_array_getSize(stackTrace);
    for(size_t i = 0; i < stackTraceSize; ++i)
    {
        sysbvm_tuple_t stackTraceRecord = sysbvm_array_at(stackTrace, i);
        sysbvm_tuple_t stackTraceRecordString = sysbvm_tuple_asString(context, stackTraceRecord);
        fprintf(stderr, SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(stackTraceRecordString));
    }
}